

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub2.c
# Opt level: O2

rt_function_error_t exec_sub2_fixed16(rt_function_t *f)

{
  rt_variable_t *prVar1;
  int16_t *arr;
  uint arr_size;
  rt_list_t shape;
  
  equalize_bits_fixed16(*f->inputs,f->inputs[1]);
  calc_arithmetic_fixed16(f,calc_sub_fixed16);
  prVar1 = *f->outputs;
  arr = (int16_t *)prVar1->data;
  shape._4_4_ = 0;
  shape.size = (prVar1->shape).size;
  shape.data = (prVar1->shape).data;
  arr_size = calc_shape_size(shape);
  rescale_fixed16(arr,arr_size,(uint)((byte)(*f->inputs)->field_0x10 >> 4),
                  (uint)((byte)(*f->outputs)->field_0x10 >> 4));
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_sub2_fixed16(rt_function_t *f) {
  equalize_bits_fixed16(f->inputs[0], f->inputs[1]);
  calc_arithmetic_fixed16(f, calc_sub_fixed16);
  rescale_fixed16(f->outputs[0]->data, calc_shape_size(f->outputs[0]->shape),
                  f->inputs[0]->fp_pos, f->outputs[0]->fp_pos);
  return RT_FUNCTION_ERROR_NOERROR;
}